

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.hpp
# Opt level: O2

Chromosome * __thiscall
crsGA::
Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
::findFittestChromosome
          (Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
           *this)

{
  __normal_iterator<const_crsGA::Chromosome<Gen,_ComputeFitness>_*,_std::vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>
  _Var1;
  
  _Var1 = std::
          __min_element<__gnu_cxx::__normal_iterator<crsGA::Chromosome<Gen,ComputeFitness>const*,std::vector<crsGA::Chromosome<Gen,ComputeFitness>,std::allocator<crsGA::Chromosome<Gen,ComputeFitness>>>>,__gnu_cxx::__ops::_Iter_comp_iter<crsGA::Population<crsGA::Chromosome<Gen,ComputeFitness>,PopulationInitializationPolicy<crsGA::Chromosome<Gen,ComputeFitness>>>::findFittestChromosome()const::_lambda(crsGA::Chromosome<Gen,ComputeFitness>const&,crsGA::Chromosome<Gen,ComputeFitness>const&)_1_>>
                    ((this->_chromosomes).
                     super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->_chromosomes).
                     super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  this->_fittestChromosomeIndex =
       ((long)_Var1._M_current -
       (long)(this->_chromosomes).
             super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
             ._M_impl.super__Vector_impl_data._M_start) / 0x28;
  return _Var1._M_current;
}

Assistant:

const Chromosome &findFittestChromosome() const
    {
        auto result = std::min_element(_chromosomes.begin(), _chromosomes.end(),
                                       [](const Chromosome &c1, const Chromosome &c2) {
                                           LOG_DEBUG("C1 Fitness:", c1.getFitness(), " C2 Fitness:", c2.getFitness());
                                           return (c1.getFitness() < c2.getFitness());
                                       });
        _fittestChromosomeIndex = std::distance(_chromosomes.begin(), result);
        return *result;
    }